

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void model_rd_for_sb_y(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                      RD_STATS *rd_stats,uint *var_out,int calculate_rd,int *early_term)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  TX_SIZE TVar4;
  uint var;
  char cVar5;
  int64_t dist;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_58;
  uint local_54;
  long local_50;
  uint *local_48;
  long local_40;
  RD_STATS *local_38;
  
  if ((early_term != (int *)0x0) && (x->force_zeromv_skip_for_blk != 0)) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }
  local_40 = (long)(*xd->mi)->ref_frame[0];
  local_48 = var_out;
  local_38 = rd_stats;
  var = (*cpi->ppi->fn_ptr[bsize].vf)
                  (x->plane[0].src.buf,x->plane[0].src.stride,xd->plane[0].dst.buf,
                   xd->plane[0].dst.stride,&local_54);
  uVar2 = local_54;
  local_58 = 0;
  TVar4 = calculate_tx_size(cpi,bsize,x,var,local_54,&local_58);
  lVar3 = local_40;
  iVar1 = local_58;
  (*xd->mi)->tx_size = TVar4;
  if (local_48 != (uint *)0x0) {
    *local_48 = var;
  }
  cVar5 = (char)local_40;
  if ((calculate_rd == 0) || ((local_58 != 0 && (cVar5 != '\0')))) {
    in_stack_ffffffffffffffa4 = 0x7fffffff;
    local_50 = 0x7fffffff;
    local_54 = uVar2;
  }
  else {
    model_rd_with_curvfit
              ((AV1_COMP *)x,(MACROBLOCK *)(ulong)bsize,(BLOCK_SIZE)uVar2,
               (uint)block_size_high[bsize] * (uint)block_size_wide[bsize],
               (int64_t)&stack0xffffffffffffffa4,(int)&local_50,in_stack_ffffffffffffff98,
               (int64_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  local_38->sse = (ulong)local_54;
  x->pred_sse[lVar3] = local_54;
  if (iVar1 != 0 && '\0' < cVar5) {
    local_50 = (ulong)local_54 << 4;
    in_stack_ffffffffffffffa4 = 0;
  }
  local_38->skip_txfm = in_stack_ffffffffffffffa4 == 0;
  local_38->rate = in_stack_ffffffffffffffa4;
  local_38->dist = local_50;
  return;
}

Assistant:

static void model_rd_for_sb_y(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              MACROBLOCK *x, MACROBLOCKD *xd,
                              RD_STATS *rd_stats, unsigned int *var_out,
                              int calculate_rd, int *early_term) {
  if (x->force_zeromv_skip_for_blk && early_term != NULL) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  assert(bsize < BLOCK_SIZES_ALL);

  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  unsigned int sse;
  int rate;
  int64_t dist;

  unsigned int var = cpi->ppi->fn_ptr[bsize].vf(
      p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, &sse);
  int force_skip = 0;
  xd->mi[0]->tx_size = calculate_tx_size(cpi, bsize, x, var, sse, &force_skip);
  if (var_out) {
    *var_out = var;
  }

  if (calculate_rd && (!force_skip || ref == INTRA_FRAME)) {
    const int bwide = block_size_wide[bsize];
    const int bhigh = block_size_high[bsize];
    model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, sse, bwide * bhigh, &rate,
                          &dist);
  } else {
    rate = INT_MAX;  // this will be overwritten later with av1_block_yrd
    dist = INT_MAX;
  }
  rd_stats->sse = sse;
  x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

  if (force_skip && ref > INTRA_FRAME) {
    rate = 0;
    dist = (int64_t)sse << 4;
  }

  assert(rate >= 0);

  rd_stats->skip_txfm = (rate == 0);
  rate = AOMMIN(rate, INT_MAX);
  rd_stats->rate = rate;
  rd_stats->dist = dist;
}